

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall cmsys::CommandLineArguments::ProcessArgument(CommandLineArguments *this,char *arg)

{
  Internal *this_00;
  String local_38;
  char *local_18;
  char *arg_local;
  CommandLineArguments *this_local;
  
  this_00 = this->Internals;
  local_18 = arg;
  arg_local = (char *)this;
  String::String(&local_38,arg);
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::push_back
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this_00,&local_38);
  String::~String(&local_38);
  return;
}

Assistant:

void CommandLineArguments::ProcessArgument(const char* arg)
{
  this->Internals->Argv.push_back(arg);
}